

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::StripLeft(FString *this)

{
  char *pcVar1;
  char *__dest;
  int iVar2;
  ulong uVar3;
  size_t len;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  pcVar1 = this->Chars;
  uVar3 = (ulong)*(uint *)(pcVar1 + -0xc);
  if (uVar3 == 0) {
    return;
  }
  uVar5 = 0;
  do {
    uVar6 = uVar3;
    if (uVar3 == uVar5) {
LAB_0054673f:
      if (*(int *)(pcVar1 + -4) < 2) {
        for (lVar4 = 0; lVar4 + uVar6 <= uVar3; lVar4 = lVar4 + 1) {
          this->Chars[lVar4] = this->Chars[uVar6 + lVar4];
        }
        ReallocBuffer(this,lVar4 - 1);
        return;
      }
      len = uVar3 - uVar6;
      AllocBuffer(this,len);
      __dest = this->Chars;
      memcpy(__dest,pcVar1 + uVar6,len);
      __dest[len] = '\0';
      FStringData::Release((FStringData *)(pcVar1 + -0xc));
      return;
    }
    iVar2 = isspace((uint)(byte)pcVar1[uVar5]);
    if (iVar2 == 0) {
      uVar6 = uVar5;
      if (uVar5 == 0) {
        return;
      }
      goto LAB_0054673f;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}